

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O2

void Psr_ManWriteVerilogSignal(FILE *pFile,Psr_Ntk_t *p,int Sig)

{
  int iVar1;
  uint uVar2;
  int h;
  char *pcVar3;
  char *pcVar4;
  
  iVar1 = Abc_Lit2Var2(Sig);
  uVar2 = Abc_Lit2Att2(Sig);
  if ((uVar2 & 1) == 0) {
    pcVar3 = Psr_NtkStr(p,iVar1);
    fputs(pcVar3,(FILE *)pFile);
    return;
  }
  if (uVar2 != 3) {
    if (uVar2 == 1) {
      h = Vec_IntEntry(&p->vSlices,iVar1);
      pcVar3 = Psr_NtkStr(p,h);
      iVar1 = Vec_IntEntry(&p->vSlices,iVar1 + 1);
      pcVar4 = Psr_NtkStr(p,iVar1);
      fprintf((FILE *)pFile,"%s%s",pcVar3,pcVar4);
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0x41,"void Psr_ManWriteVerilogSignal(FILE *, Psr_Ntk_t *, int)");
  }
  Psr_CatSignals_V._0_4_ = Vec_IntEntry(&p->vConcats,iVar1);
  Psr_CatSignals_V._4_4_ = Psr_CatSignals_V._0_4_;
  Psr_CatSignals_V._8_8_ = Vec_IntEntryP(&p->vConcats,iVar1 + 1);
  fputc(0x7b,(FILE *)pFile);
  Psr_ManWriteVerilogArray(pFile,p,(Vec_Int_t *)Psr_CatSignals_V,0,Psr_CatSignals_V._4_4_,0);
  fputc(0x7d,(FILE *)pFile);
  return;
}

Assistant:

static void Psr_ManWriteVerilogSignal( FILE * pFile, Psr_Ntk_t * p, int Sig )
{
    int Value = Abc_Lit2Var2( Sig );
    Psr_ManType_t Type = (Psr_ManType_t)Abc_Lit2Att2( Sig );
    if ( Type == BAC_PRS_NAME || Type == BAC_PRS_CONST )
        fprintf( pFile, "%s", Psr_NtkStr(p, Value) );
    else if ( Type == BAC_PRS_SLICE )
        fprintf( pFile, "%s%s", Psr_NtkStr(p, Psr_SliceName(p, Value)), Psr_NtkStr(p, Psr_SliceRange(p, Value)) );
    else if ( Type == BAC_PRS_CONCAT )
        Psr_ManWriteVerilogConcat( pFile, p, Value );
    else assert( 0 );
}